

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

SharedPtr __thiscall
deqp::gles31::Functional::anon_unknown_0::generateRandomShaderSet
          (anon_unknown_0 *this,Random *rnd,GLSLVersion glslVersion,bool onlyExtensionStages)

{
  long *plVar1;
  int *piVar2;
  deBool dVar3;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined7 in_register_00000009;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *extraout_RDX_03;
  SharedPtrStateBase *extraout_RDX_04;
  SharedPtrStateBase *extraout_RDX_05;
  SharedPtrStateBase *pSVar9;
  bool bVar10;
  float fVar11;
  SharedPtr SVar12;
  SharedPtr program;
  long *plStack_40;
  
  if ((int)CONCAT71(in_register_00000009,onlyExtensionStages) == 0) {
    fVar11 = deRandom_getFloat(&rnd->m_rnd);
    if (0.5 <= fVar11) {
      fVar11 = deRandom_getFloat(&rnd->m_rnd);
      if (0.5 <= fVar11) {
        puVar7 = (undefined8 *)operator_new(0x28);
        *(undefined4 *)(puVar7 + 1) = 0;
        puVar7[2] = 0;
        puVar7[3] = 0;
        *puVar7 = &PTR__Node_00b52730;
        *(undefined1 *)(puVar7 + 4) = 1;
        plStack_40 = (long *)operator_new(0x20);
        *(undefined4 *)(plStack_40 + 1) = 0;
        *(undefined4 *)((long)plStack_40 + 0xc) = 0;
        *plStack_40 = (long)&PTR__SharedPtrState_00b52798;
        plStack_40[2] = (long)puVar7;
        *(undefined4 *)(plStack_40 + 1) = 1;
        *(undefined4 *)((long)plStack_40 + 0xc) = 1;
        dVar3 = deRandom_getBool(&rnd->m_rnd);
        puVar8 = (undefined8 *)operator_new(0x28);
        *puVar8 = &PTR__Node_00b52778;
        *(undefined4 *)(puVar8 + 1) = 1;
        puVar8[2] = puVar7;
        puVar8[3] = plStack_40;
        LOCK();
        *(int *)(plStack_40 + 1) = (int)plStack_40[1] + 1;
        UNLOCK();
        LOCK();
        *(int *)(puVar8[3] + 0xc) = *(int *)(puVar8[3] + 0xc) + 1;
        UNLOCK();
        *puVar8 = &PTR__Node_00b527d8;
        *(uint *)(puVar8 + 4) = (uint)(dVar3 != 1);
        *(GLSLVersion *)((long)puVar8 + 0x24) = glslVersion;
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
        *(undefined8 **)this = puVar8;
        puVar7 = (undefined8 *)operator_new(0x20);
        *(undefined4 *)(puVar7 + 1) = 0;
        *(undefined4 *)((long)puVar7 + 0xc) = 0;
        *puVar7 = &PTR__SharedPtrState_00b52798;
        pSVar9 = extraout_RDX_00;
        goto LAB_00535a8f;
      }
      puVar7 = (undefined8 *)operator_new(0x28);
      *(undefined4 *)(puVar7 + 1) = 0;
      puVar7[2] = 0;
      puVar7[3] = 0;
      *puVar7 = &PTR__Node_00b52730;
      *(undefined1 *)(puVar7 + 4) = 0;
      plStack_40 = (long *)operator_new(0x20);
      *(undefined4 *)(plStack_40 + 1) = 0;
      *(undefined4 *)((long)plStack_40 + 0xc) = 0;
      *plStack_40 = (long)&PTR__SharedPtrState_00b52798;
      plStack_40[2] = (long)puVar7;
      *(undefined4 *)(plStack_40 + 1) = 1;
      *(undefined4 *)((long)plStack_40 + 0xc) = 1;
      puVar8 = (undefined8 *)operator_new(0x30);
      *puVar8 = &PTR__Node_00b52778;
      *(undefined4 *)(puVar8 + 1) = 9;
      puVar8[2] = puVar7;
      puVar8[3] = plStack_40;
      LOCK();
      *(int *)(plStack_40 + 1) = (int)plStack_40[1] + 1;
      UNLOCK();
      LOCK();
      *(int *)(puVar8[3] + 0xc) = *(int *)(puVar8[3] + 0xc) + 1;
      UNLOCK();
      *puVar8 = &PTR__Node_00b52c20;
      *(GLSLVersion *)(puVar8 + 4) = glslVersion;
      *(undefined8 *)((long)puVar8 + 0x24) = 0;
      *(undefined4 *)((long)puVar8 + 0x2c) = 0;
      dVar3 = deRandom_getBool(&rnd->m_rnd);
      if (dVar3 == 1) {
        *(undefined1 *)((long)puVar8 + 0x24) = 1;
        *(undefined1 *)((long)puVar8 + 0x2a) = 1;
        dVar3 = deRandom_getBool(&rnd->m_rnd);
        bVar10 = dVar3 == 1;
      }
      else {
        dVar3 = deRandom_getBool(&rnd->m_rnd);
        *(undefined1 *)((long)puVar8 + 0x24) = 1;
        *(bool *)((long)puVar8 + 0x2a) = dVar3 == 1;
        bVar10 = true;
      }
      *(undefined1 *)((long)puVar8 + 0x25) = 1;
      *(bool *)((long)puVar8 + 0x2b) = bVar10;
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      *(undefined8 **)this = puVar8;
      puVar7 = (undefined8 *)operator_new(0x20);
      pSVar9 = extraout_RDX_02;
      goto LAB_00535afd;
    }
    puVar7 = (undefined8 *)operator_new(0x28);
    *(undefined4 *)(puVar7 + 1) = 0;
    puVar7[2] = 0;
    puVar7[3] = 0;
    *puVar7 = &PTR__Node_00b52730;
    *(undefined1 *)(puVar7 + 4) = 0;
    plStack_40 = (long *)operator_new(0x20);
    *(undefined4 *)(plStack_40 + 1) = 0;
    *(undefined4 *)((long)plStack_40 + 0xc) = 0;
    *plStack_40 = (long)&PTR__SharedPtrState_00b52798;
    plStack_40[2] = (long)puVar7;
    *(undefined4 *)(plStack_40 + 1) = 1;
    *(undefined4 *)((long)plStack_40 + 0xc) = 1;
    puVar8 = (undefined8 *)operator_new(0x28);
    *puVar8 = &PTR__Node_00b52778;
    *(undefined4 *)(puVar8 + 1) = 1;
    puVar8[2] = puVar7;
    puVar8[3] = plStack_40;
    LOCK();
    *(int *)(plStack_40 + 1) = (int)plStack_40[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(puVar8[3] + 0xc) = *(int *)(puVar8[3] + 0xc) + 1;
    UNLOCK();
    *puVar8 = &PTR__Node_00b527d8;
    *(undefined4 *)(puVar8 + 4) = 5;
    *(GLSLVersion *)((long)puVar8 + 0x24) = glslVersion;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 **)this = puVar8;
    puVar7 = (undefined8 *)operator_new(0x20);
    *(undefined4 *)(puVar7 + 1) = 0;
    *(undefined4 *)((long)puVar7 + 0xc) = 0;
    *puVar7 = &PTR__SharedPtrState_00b52798;
    pSVar9 = extraout_RDX;
  }
  else {
    fVar11 = deRandom_getFloat(&rnd->m_rnd);
    if (0.5 <= fVar11) {
      puVar7 = (undefined8 *)operator_new(0x28);
      *(undefined4 *)(puVar7 + 1) = 0;
      puVar7[2] = 0;
      puVar7[3] = 0;
      *puVar7 = &PTR__Node_00b52730;
      *(undefined1 *)(puVar7 + 4) = 1;
      plStack_40 = (long *)operator_new(0x20);
      *(undefined4 *)(plStack_40 + 1) = 0;
      *(undefined4 *)((long)plStack_40 + 0xc) = 0;
      *plStack_40 = (long)&PTR__SharedPtrState_00b52798;
      plStack_40[2] = (long)puVar7;
      *(undefined4 *)(plStack_40 + 1) = 1;
      *(undefined4 *)((long)plStack_40 + 0xc) = 1;
      dVar5 = deRandom_getUint32(&rnd->m_rnd);
      uVar6 = dVar5 % 3;
      if (uVar6 == 0) {
        iVar4 = 2;
      }
      else if (uVar6 == 1) {
        iVar4 = 3;
      }
      else {
        iVar4 = (uint)(uVar6 != 2) * 2 + 4;
      }
      puVar8 = (undefined8 *)operator_new(0x28);
      *puVar8 = &PTR__Node_00b52778;
      *(undefined4 *)(puVar8 + 1) = 1;
      puVar8[2] = puVar7;
      puVar8[3] = plStack_40;
      LOCK();
      *(int *)(plStack_40 + 1) = (int)plStack_40[1] + 1;
      UNLOCK();
      LOCK();
      *(int *)(puVar8[3] + 0xc) = *(int *)(puVar8[3] + 0xc) + 1;
      UNLOCK();
      *puVar8 = &PTR__Node_00b527d8;
      *(int *)(puVar8 + 4) = iVar4;
      *(GLSLVersion *)((long)puVar8 + 0x24) = glslVersion;
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      *(undefined8 **)this = puVar8;
      puVar7 = (undefined8 *)operator_new(0x20);
      *(undefined4 *)(puVar7 + 1) = 0;
      *(undefined4 *)((long)puVar7 + 0xc) = 0;
      *puVar7 = &PTR__SharedPtrState_00b52798;
      pSVar9 = extraout_RDX_01;
LAB_00535a8f:
      puVar7[2] = puVar8;
      goto LAB_00535b13;
    }
    puVar7 = (undefined8 *)operator_new(0x28);
    *(undefined4 *)(puVar7 + 1) = 0;
    puVar7[2] = 0;
    puVar7[3] = 0;
    *puVar7 = &PTR__Node_00b52730;
    *(undefined1 *)(puVar7 + 4) = 0;
    plStack_40 = (long *)operator_new(0x20);
    *(undefined4 *)(plStack_40 + 1) = 0;
    *(undefined4 *)((long)plStack_40 + 0xc) = 0;
    *plStack_40 = (long)&PTR__SharedPtrState_00b52798;
    plStack_40[2] = (long)puVar7;
    *(undefined4 *)(plStack_40 + 1) = 1;
    *(undefined4 *)((long)plStack_40 + 0xc) = 1;
    puVar8 = (undefined8 *)operator_new(0x30);
    *puVar8 = &PTR__Node_00b52778;
    *(undefined4 *)(puVar8 + 1) = 9;
    puVar8[2] = puVar7;
    puVar8[3] = plStack_40;
    LOCK();
    *(int *)(plStack_40 + 1) = (int)plStack_40[1] + 1;
    UNLOCK();
    LOCK();
    *(int *)(puVar8[3] + 0xc) = *(int *)(puVar8[3] + 0xc) + 1;
    UNLOCK();
    *puVar8 = &PTR__Node_00b52c20;
    *(GLSLVersion *)(puVar8 + 4) = glslVersion;
    *(undefined8 *)((long)puVar8 + 0x24) = 0;
    *(undefined4 *)((long)puVar8 + 0x2c) = 0;
    dVar3 = deRandom_getBool(&rnd->m_rnd);
    *(undefined1 *)((long)puVar8 + 0x24) = 1;
    *(bool *)((long)puVar8 + 0x2a) = dVar3 == 1;
    dVar3 = deRandom_getBool(&rnd->m_rnd);
    *(undefined1 *)((long)puVar8 + 0x25) = 1;
    *(bool *)((long)puVar8 + 0x2b) = dVar3 == 1;
    dVar3 = deRandom_getBool(&rnd->m_rnd);
    if (dVar3 == 1) {
      *(undefined1 *)((long)puVar8 + 0x26) = 1;
      *(undefined1 *)((long)puVar8 + 0x2c) = 1;
      dVar3 = deRandom_getBool(&rnd->m_rnd);
      if (dVar3 == 1) {
        dVar3 = deRandom_getBool(&rnd->m_rnd);
        *(undefined1 *)((long)puVar8 + 0x27) = 1;
        *(bool *)((long)puVar8 + 0x2d) = dVar3 == 1;
        iVar4 = deRandom_getBool(&rnd->m_rnd);
LAB_00535a03:
        bVar10 = iVar4 == 1;
        goto LAB_00535ae1;
      }
    }
    else {
      dVar3 = deRandom_getBool(&rnd->m_rnd);
      *(undefined1 *)((long)puVar8 + 0x26) = 1;
      *(bool *)((long)puVar8 + 0x2c) = dVar3 == 1;
      dVar3 = deRandom_getBool(&rnd->m_rnd);
      if (dVar3 == 1) {
        *(undefined1 *)((long)puVar8 + 0x27) = 1;
        *(undefined1 *)((long)puVar8 + 0x2d) = 1;
        iVar4 = deRandom_getBool(&rnd->m_rnd);
        goto LAB_00535a03;
      }
      dVar3 = deRandom_getBool(&rnd->m_rnd);
      *(undefined1 *)((long)puVar8 + 0x27) = 1;
      *(bool *)((long)puVar8 + 0x2d) = dVar3 == 1;
      bVar10 = true;
LAB_00535ae1:
      *(undefined1 *)(puVar8 + 5) = 1;
      *(bool *)((long)puVar8 + 0x2e) = bVar10;
    }
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 **)this = puVar8;
    puVar7 = (undefined8 *)operator_new(0x20);
    pSVar9 = extraout_RDX_03;
LAB_00535afd:
    *(undefined4 *)(puVar7 + 1) = 0;
    *(undefined4 *)((long)puVar7 + 0xc) = 0;
    *puVar7 = &PTR__SharedPtrState_00b52798;
  }
  puVar7[2] = puVar8;
LAB_00535b13:
  *(undefined8 **)(this + 8) = puVar7;
  *(undefined4 *)(puVar7 + 1) = 1;
  *(undefined4 *)((long)puVar7 + 0xc) = 1;
  if (plStack_40 != (long *)0x0) {
    LOCK();
    plVar1 = plStack_40 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plStack_40 + 0x10))();
      pSVar9 = extraout_RDX_04;
    }
    LOCK();
    piVar2 = (int *)((long)plStack_40 + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) && (plStack_40 != (long *)0x0)) {
      (**(code **)(*plStack_40 + 8))();
      pSVar9 = extraout_RDX_05;
    }
  }
  SVar12.m_state = pSVar9;
  SVar12.m_ptr = (Node *)this;
  return SVar12;
}

Assistant:

static ResourceDefinition::Node::SharedPtr generateRandomShaderSet (de::Random& rnd, glu::GLSLVersion glslVersion, bool onlyExtensionStages)
{
	if (!onlyExtensionStages)
		return generateRandomCoreShaderSet(rnd, glslVersion);
	else
		return generateRandomExtShaderSet(rnd, glslVersion);
}